

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field_lite.cc
# Opt level: O1

FieldDescriptor *
google::protobuf::compiler::java::anon_unknown_1::ValueField(FieldDescriptor *descriptor)

{
  LogMessage *pLVar1;
  Descriptor *this;
  FieldDescriptor *pFVar2;
  string local_a8;
  FieldDescriptor *local_88 [7];
  code *local_50 [7];
  
  if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
    local_50[0] = FieldDescriptor::TypeOnceInit;
    local_88[0] = descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x18),local_50,local_88);
  }
  if (descriptor[2] != (FieldDescriptor)0xb) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_map_field_lite.cc"
               ,0x38);
    pLVar1 = internal::LogMessage::operator<<
                       ((LogMessage *)local_50,
                        "CHECK failed: (FieldDescriptor::TYPE_MESSAGE) == (descriptor->type()): ");
    internal::LogFinisher::operator=((LogFinisher *)local_88,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)local_50);
  }
  this = FieldDescriptor::message_type(descriptor);
  if (*(char *)(*(long *)(this + 0x20) + 0x4b) == '\0') {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_map_field_lite.cc"
               ,0x3a);
    pLVar1 = internal::LogMessage::operator<<
                       ((LogMessage *)local_88,"CHECK failed: message->options().map_entry(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)local_88);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"value","");
  pFVar2 = Descriptor::FindFieldByName(this,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return pFVar2;
}

Assistant:

const FieldDescriptor* ValueField(const FieldDescriptor* descriptor) {
  GOOGLE_CHECK_EQ(FieldDescriptor::TYPE_MESSAGE, descriptor->type());
  const Descriptor* message = descriptor->message_type();
  GOOGLE_CHECK(message->options().map_entry());
  return message->FindFieldByName("value");
}